

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_suite.cpp
# Opt level: O0

void value_find_suite::find_const_integer(void)

{
  index_type *this;
  bool bVar1;
  basic_variable<std::allocator<char>_> *in_RCX;
  char *pcVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_8c0;
  const_iterator local_860;
  basic_variable<std::allocator<char>_> local_848;
  undefined1 local_810 [8];
  const_iterator where_24;
  basic_variable<std::allocator<char>_> local_7d8;
  undefined1 local_7a8 [64];
  undefined1 local_768 [8];
  const_iterator where_23;
  basic_variable<std::allocator<char>_> local_738;
  undefined1 local_700 [8];
  const_iterator where_22;
  allocator<char32_t> local_6c9;
  undefined1 local_6c8 [40];
  const_iterator where_21;
  undefined1 local_678 [8];
  const_iterator where_20;
  basic_variable<std::allocator<char>_> local_648;
  undefined1 local_610 [8];
  const_iterator where_19;
  allocator<char16_t> local_5d9;
  undefined1 local_5d8 [40];
  const_iterator where_18;
  undefined1 local_588 [8];
  const_iterator where_17;
  basic_variable<std::allocator<char>_> local_558;
  undefined1 local_520 [8];
  const_iterator where_16;
  allocator<wchar_t> local_4e9;
  undefined1 local_4e8 [40];
  const_iterator where_15;
  undefined1 local_498 [8];
  const_iterator where_14;
  basic_variable<std::allocator<char>_> local_468;
  undefined1 local_430 [8];
  const_iterator where_13;
  allocator<char> local_3f9;
  undefined1 local_3f8 [40];
  const_iterator where_12;
  undefined1 local_3a8 [8];
  const_iterator where_11;
  basic_variable<std::allocator<char>_> local_378;
  undefined1 local_340 [8];
  const_iterator where_10;
  undefined1 local_310 [16];
  const_iterator where_9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_2a0 [8];
  const_iterator where_8;
  undefined1 local_26c [12];
  const_iterator where_7;
  basic_variable<std::allocator<char>_> local_238;
  undefined1 local_200 [8];
  const_iterator where_6;
  undefined1 local_1cc [12];
  const_iterator where_5;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_160 [8];
  const_iterator where_4;
  undefined1 local_129 [9];
  const_iterator where_3;
  basic_variable<std::allocator<char>_> local_f8;
  undefined1 local_c8 [8];
  const_iterator where_2;
  undefined1 local_94 [12];
  const_iterator where_1;
  undefined1 local_50 [8];
  const_iterator where;
  variable data;
  
  this = &where.
          super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
          .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)this,2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_50,(value *)this,(basic_variable<std::allocator<char>_> *)this,
             in_RCX);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    ((const_iterator *)local_50,
                     (const_iterator *)
                     &where_1.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x23e,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_50);
  local_94._0_4_ = 0;
  trial::dynamic::value::find<std::allocator<char>,trial::dynamic::nullable>
            ((const_iterator *)(local_94 + 4),
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)local_94,
             (nullable *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)(local_94 + 4),
                     (const_iterator *)
                     &where_2.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x243,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(local_94 + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_f8);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_c8,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,&local_f8,(basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_c8,
                     (const_iterator *)
                     &where_3.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x247,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_c8);
  local_129[0] = '\x01';
  trial::dynamic::value::find<std::allocator<char>,bool>
            ((const_iterator *)(local_129 + 1),
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)local_129,
             (bool *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)(local_129 + 1),
                     (const_iterator *)
                     &where_4.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x24c,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(local_129 + 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,true);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_160,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,&local_198,(basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_160,
                     (const_iterator *)
                     &where_5.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x250,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_160);
  local_1cc._0_4_ = 2;
  trial::dynamic::value::find<std::allocator<char>,int>
            ((const_iterator *)(local_1cc + 4),
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)local_1cc,
             (int *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    ((const_iterator *)(local_1cc + 4),
                     (const_iterator *)
                     &where_6.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x255,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(local_1cc + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_238,2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_200,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,&local_238,(basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    ((const_iterator *)local_200,
                     (const_iterator *)
                     &where_7.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x259,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_200);
  local_26c._0_4_ = 0x16;
  trial::dynamic::value::find<std::allocator<char>,int>
            ((const_iterator *)(local_26c + 4),
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)local_26c,
             (int *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_8.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)(local_26c + 4),
                     (const_iterator *)
                     &where_8.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x25d,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_8.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(local_26c + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2d8,0x16);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_2a0,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,&local_2d8,(basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_9.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_2a0,
                     (const_iterator *)
                     &where_9.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x261,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_9.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_2a0);
  local_310._0_8_ = 0x4008000000000000;
  trial::dynamic::value::find<std::allocator<char>,double>
            ((const_iterator *)(local_310 + 8),
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)local_310,
             (double *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)(local_310 + 8),
                     (const_iterator *)
                     &where_10.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x266,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(local_310 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_378,3.0);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_340,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,&local_378,(basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_340,
                     (const_iterator *)
                     &where_11.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x26a,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_340);
  trial::dynamic::value::find<std::allocator<char>,char[9]>
            ((const_iterator *)local_3a8,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)"hydrogen",
             (char (*) [9])pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_12.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_3a8,
                     (const_iterator *)
                     &where_12.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x26f,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_12.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3f8,"hydrogen",&local_3f9);
  trial::dynamic::value::find<std::allocator<char>,std::__cxx11::string>
            ((const_iterator *)(local_3f8 + 0x20),
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)local_3f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar2);
  std::__cxx11::string::~string((string *)local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_13.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)(local_3f8 + 0x20),
                     (const_iterator *)
                     &where_13.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x273,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_13.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(local_3f8 + 0x20));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_468,"hydrogen");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_430,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,&local_468,(basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_14.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_430,
                     (const_iterator *)
                     &where_14.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x277,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_14.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_430);
  trial::dynamic::value::find<std::allocator<char>,wchar_t[9]>
            ((const_iterator *)local_498,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)L"hydrogen",
             (wchar_t (*) [9])pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_15.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_498,
                     (const_iterator *)
                     &where_15.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x27c,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_15.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_498);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_4e8,L"hydrogen",&local_4e9);
  trial::dynamic::value::find<std::allocator<char>,std::__cxx11::wstring>
            ((const_iterator *)(local_4e8 + 0x20),
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)local_4e8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)pcVar2);
  std::__cxx11::wstring::~wstring((wstring *)local_4e8);
  std::allocator<wchar_t>::~allocator(&local_4e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_16.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)(local_4e8 + 0x20),
                     (const_iterator *)
                     &where_16.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x280,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_16.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(local_4e8 + 0x20));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_558,L"hydrogen");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_520,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,&local_558,(basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_17.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_520,
                     (const_iterator *)
                     &where_17.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x284,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_17.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_520);
  trial::dynamic::value::find<std::allocator<char>,char16_t[9]>
            ((const_iterator *)local_588,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)L"hydrogen",
             (char16_t (*) [9])pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_18.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_588,
                     (const_iterator *)
                     &where_18.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x289,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_18.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_588);
  std::allocator<char16_t>::allocator(&local_5d9);
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>
            ((u16string *)local_5d8,L"hydrogen",&local_5d9);
  trial::dynamic::value::find<std::allocator<char>,std::__cxx11::u16string>
            ((const_iterator *)(local_5d8 + 0x20),
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)local_5d8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)pcVar2
            );
  std::__cxx11::u16string::~u16string((u16string *)local_5d8);
  std::allocator<char16_t>::~allocator(&local_5d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_19.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)(local_5d8 + 0x20),
                     (const_iterator *)
                     &where_19.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x28d,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_19.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(local_5d8 + 0x20));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_648,L"hydrogen");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_610,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,&local_648,(basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_20.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_610,
                     (const_iterator *)
                     &where_20.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x291,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_20.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_610);
  trial::dynamic::value::find<std::allocator<char>,char32_t[9]>
            ((const_iterator *)local_678,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)L"hydrogen",
             (char32_t (*) [9])pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_21.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_678,
                     (const_iterator *)
                     &where_21.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x296,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_21.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_678);
  std::allocator<char32_t>::allocator(&local_6c9);
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)local_6c8,L"hydrogen",&local_6c9);
  trial::dynamic::value::find<std::allocator<char>,std::__cxx11::u32string>
            ((const_iterator *)(local_6c8 + 0x20),
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)local_6c8,
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)pcVar2
            );
  std::__cxx11::u32string::~u32string((u32string *)local_6c8);
  std::allocator<char32_t>::~allocator(&local_6c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_22.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)(local_6c8 + 0x20),
                     (const_iterator *)
                     &where_22.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x29a,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_22.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(local_6c8 + 0x20));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_738,L"hydrogen");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_700,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,&local_738,(basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_738);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_23.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_700,
                     (const_iterator *)
                     &where_23.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x29e,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_23.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_700);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_7d8,2);
  local_7a8._0_8_ = &local_7d8;
  local_7a8._8_8_ = 1;
  init._M_len = (size_type)pcVar2;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_7a8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_7a8._0_8_,init);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_768,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,(basic_variable<std::allocator<char>_> *)(local_7a8 + 0x10),
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_7a8 + 0x10));
  local_8c0 = (basic_variable<std::allocator<char>_> *)local_7a8;
  do {
    local_8c0 = local_8c0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8c0);
  } while (local_8c0 != &local_7d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &where_24.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_768,
                     (const_iterator *)
                     &where_24.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_const_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x2a3,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &where_24.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_768);
  trial::dynamic::basic_map<std::allocator<char>>::make<char_const*,int>
            (&local_848,(basic_map<std::allocator<char>> *)"alpha",(char *)0x2,(int)pcVar2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((const_iterator *)local_810,
             (value *)&where.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current,&local_848,(basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_848);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_860,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_810,&local_860);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x2a8,"void value_find_suite::find_const_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_860)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_810);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void find_const_integer()
{
    const variable data(2);
    {
        variable::const_iterator where = value::find(data, data);
        TRIAL_PROTOCOL_TEST(where != data.end());
    }
    // integer - null
    {
        variable::const_iterator where = value::find(data, null);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, variable());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - boolean
    {
        variable::const_iterator where = value::find(data, true);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, variable(true));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - integer
    {
        variable::const_iterator where = value::find(data, 2);
        TRIAL_PROTOCOL_TEST(where != data.end());
    }
    {
        variable::const_iterator where = value::find(data, variable(2));
        TRIAL_PROTOCOL_TEST(where != data.end());
    }
    {
        variable::const_iterator where = value::find(data, 22);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, variable(22));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - real
    {
        variable::const_iterator where = value::find(data, 3.0);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, variable(3.0));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - string
    {
        variable::const_iterator where = value::find(data, "hydrogen");
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, std::string("hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, variable("hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - wstring
    {
        variable::const_iterator where = value::find(data, L"hydrogen");
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, std::wstring(L"hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, variable(L"hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - u16string
    {
        variable::const_iterator where = value::find(data, u"hydrogen");
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, std::u16string(u"hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, variable(u"hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - u32string
    {
        variable::const_iterator where = value::find(data, U"hydrogen");
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, std::u32string(U"hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::const_iterator where = value::find(data, variable(U"hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - array
    {
        variable::const_iterator where = value::find(data, array::make({2}));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - map
    {
        variable::const_iterator where = value::find(data, map::make("alpha", 2));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
}